

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

void cram_free_compression_header(cram_block_compression_hdr *hdr)

{
  cram_map *pcVar1;
  cram_map *m2_1;
  cram_map *m_1;
  cram_map *m2;
  cram_map *m;
  int i;
  cram_block_compression_hdr *hdr_local;
  
  if (hdr->landmark != (int32_t *)0x0) {
    free(hdr->landmark);
  }
  if (hdr->preservation_map != (kh_map_t *)0x0) {
    kh_destroy_map(hdr->preservation_map);
  }
  for (m._4_4_ = 0; m._4_4_ < 0x20; m._4_4_ = m._4_4_ + 1) {
    m2 = hdr->rec_encoding_map[m._4_4_];
    while (m2 != (cram_map *)0x0) {
      pcVar1 = m2->next;
      if (m2->codec != (cram_codec *)0x0) {
        (*m2->codec->free)(m2->codec);
      }
      free(m2);
      m2 = pcVar1;
    }
  }
  for (m._4_4_ = 0; m._4_4_ < 0x20; m._4_4_ = m._4_4_ + 1) {
    m2_1 = hdr->tag_encoding_map[m._4_4_];
    while (m2_1 != (cram_map *)0x0) {
      pcVar1 = m2_1->next;
      if (m2_1->codec != (cram_codec *)0x0) {
        (*m2_1->codec->free)(m2_1->codec);
      }
      free(m2_1);
      m2_1 = pcVar1;
    }
  }
  for (m._4_4_ = 0; m._4_4_ < 0x2f; m._4_4_ = m._4_4_ + 1) {
    if (hdr->codecs[m._4_4_] != (cram_codec *)0x0) {
      (*hdr->codecs[m._4_4_]->free)(hdr->codecs[m._4_4_]);
    }
  }
  if (hdr->TL != (uchar **)0x0) {
    free(hdr->TL);
  }
  if (hdr->TD_blk != (cram_block *)0x0) {
    cram_free_block(hdr->TD_blk);
  }
  if (hdr->TD_hash != (kh_m_s2i_t *)0x0) {
    kh_destroy_m_s2i(hdr->TD_hash);
  }
  if (hdr->TD_keys != (string_alloc_t *)0x0) {
    string_pool_destroy(hdr->TD_keys);
  }
  free(hdr);
  return;
}

Assistant:

void cram_free_compression_header(cram_block_compression_hdr *hdr) {
    int i;

    if (hdr->landmark)
	free(hdr->landmark);

    if (hdr->preservation_map)
	kh_destroy(map, hdr->preservation_map);

    for (i = 0; i < CRAM_MAP_HASH; i++) {
	cram_map *m, *m2;
	for (m = hdr->rec_encoding_map[i]; m; m = m2) {
	    m2 = m->next;
	    if (m->codec)
		m->codec->free(m->codec);
	    free(m);
	}
    }

    for (i = 0; i < CRAM_MAP_HASH; i++) {
	cram_map *m, *m2;
	for (m = hdr->tag_encoding_map[i]; m; m = m2) {
	    m2 = m->next;
	    if (m->codec)
		m->codec->free(m->codec);
	    free(m);
	}
    }

    for (i = 0; i < DS_END; i++) {
	if (hdr->codecs[i])
	    hdr->codecs[i]->free(hdr->codecs[i]);
    }

    if (hdr->TL)
	free(hdr->TL);
    if (hdr->TD_blk)
	cram_free_block(hdr->TD_blk);
    if (hdr->TD_hash)
	kh_destroy(m_s2i, hdr->TD_hash);
    if (hdr->TD_keys)
	string_pool_destroy(hdr->TD_keys);

    free(hdr);
}